

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxIn
          (vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
           *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          Privkey *blinding_key,Privkey *token_blinding_key)

{
  ByteData *this_00;
  ByteData256 *this_01;
  ByteData256 *this_02;
  ByteData *this_03;
  ByteData issuance_amount_rangeproof;
  ByteData inflation_keys_rangeproof;
  bool bVar1;
  bool bVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  pointer puVar5;
  size_t sVar6;
  _func_int **pp_Var7;
  void *pvVar8;
  CfdException *this_04;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  bool bVar12;
  pointer in_stack_fffffffffffffa58;
  undefined4 uStack_5a0;
  uint32_t tx_in_index_local;
  ByteData token_rangeproof;
  ByteData amount_rangeproof;
  UnblindParameter local_558;
  void *local_4c8;
  void *pvStack_4c0;
  long local_4b8;
  ByteData256 local_4a8;
  ByteData256 local_488;
  void *local_468;
  void *pvStack_460;
  long local_458;
  ByteData local_448;
  ByteData local_428;
  ConfidentialValue local_410;
  UnblindParameter asset_unblind;
  UnblindParameter token_unblind;
  ConfidentialValue local_2b0;
  ConfidentialValue local_288;
  ConfidentialValue local_260;
  Script local_238;
  ConfidentialTxIn tx_in;
  IssuanceParameter issue;
  
  tx_in_index_local = tx_in_index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0xb0d,"UnblindTxIn");
  ConfidentialTxIn::ConfidentialTxIn
            (&tx_in,(this->vin_).
                    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                    ._M_impl.super__Vector_impl_data._M_start + tx_in_index_local);
  ConfidentialValue::ConfidentialValue((ConfidentialValue *)&asset_unblind,&tx_in.issuance_amount_);
  bVar11 = asset_unblind.asset.version_ < 2;
  if (bVar11) {
    ConfidentialValue::ConfidentialValue(&local_260,&tx_in.inflation_keys_);
    if (local_260.version_ < 2) {
      bVar11 = true;
      bVar2 = false;
      bVar1 = false;
      bVar12 = true;
      goto LAB_0048716a;
    }
  }
  local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = (long)tx_in.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)tx_in.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar9 == 0) {
    puVar5 = (pointer)0x0;
  }
  else {
    if ((long)uVar9 < 0) {
      ::std::__throw_bad_alloc();
    }
    puVar5 = (pointer)operator_new(uVar9);
  }
  local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar5 + uVar9;
  sVar10 = (long)tx_in.issuance_amount_rangeproof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)tx_in.issuance_amount_rangeproof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar5;
  if (sVar10 != 0) {
    local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
    memmove(puVar5,tx_in.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar10);
  }
  local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar5 + sVar10;
  sVar6 = ByteData::GetDataSize(&local_428);
  if (sVar6 == 0) {
    local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar9 = (long)tx_in.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      puVar5 = (pointer)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar5 = (pointer)operator_new(uVar9);
    }
    local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar5 + uVar9;
    sVar10 = (long)tx_in.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)tx_in.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar5;
    if (sVar10 != 0) {
      local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5;
      memmove(puVar5,tx_in.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5 + sVar10;
    sVar6 = ByteData::GetDataSize(&local_448);
    bVar12 = sVar6 == 0;
    bVar2 = true;
    bVar1 = true;
  }
  else {
    bVar2 = true;
    bVar1 = false;
    bVar12 = false;
  }
LAB_0048716a:
  if ((bVar1) &&
     (local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_448.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((bVar2) &&
     (local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_428.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (bVar11) {
    local_260._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
    if (local_260.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  asset_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialValue_006a2070;
  if ((void *)CONCAT44(asset_unblind.asset.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       asset_unblind.asset.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(asset_unblind.asset.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     asset_unblind.asset.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (!bVar12) {
    AbstractTxIn::GetTxid((Txid *)&asset_unblind,&tx_in.super_AbstractTxIn);
    uVar4 = AbstractTxIn::GetVout(&tx_in.super_AbstractTxIn);
    token_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar9 = (long)tx_in.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      pp_Var7 = (_func_int **)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      pp_Var7 = (_func_int **)operator_new(uVar9);
    }
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(uVar9 + (long)pp_Var7);
    sVar10 = (long)tx_in.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)tx_in.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    token_unblind.asset._vptr_ConfidentialAssetId = pp_Var7;
    if (sVar10 != 0) {
      token_unblind.asset.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pp_Var7;
      memmove(pp_Var7,tx_in.asset_entropy_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar10);
    }
    token_unblind.asset.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((long)pp_Var7 + sVar10);
    local_558.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
    local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar9 = (long)tx_in.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      pp_Var7 = (_func_int **)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      pp_Var7 = (_func_int **)operator_new(uVar9);
    }
    local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar9 + (long)pp_Var7);
    sVar10 = (long)tx_in.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)tx_in.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_558.asset._vptr_ConfidentialAssetId = pp_Var7;
    if (sVar10 != 0) {
      local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pp_Var7;
      memmove(pp_Var7,tx_in.blinding_nonce_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar10);
    }
    local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)((long)pp_Var7 + sVar10);
    CalculateIssuanceValue
              (&issue,(Txid *)&asset_unblind,uVar4,true,(ByteData256 *)&token_unblind,
               (ByteData256 *)&local_558);
    if (local_558.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      operator_delete(local_558.asset._vptr_ConfidentialAssetId);
    }
    if (token_unblind.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      operator_delete(token_unblind.asset._vptr_ConfidentialAssetId);
    }
    asset_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__Txid_0068dcd8;
    if ((void *)CONCAT44(asset_unblind.asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         asset_unblind.asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(asset_unblind.asset.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       asset_unblind.asset.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    amount_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    amount_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    amount_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar9 = (long)tx_in.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      puVar5 = (pointer)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar5 = (pointer)operator_new(uVar9);
    }
    amount_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = puVar5 + uVar9;
    sVar10 = (long)tx_in.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)tx_in.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    amount_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = puVar5;
    if (sVar10 != 0) {
      amount_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar5;
      memmove(puVar5,tx_in.issuance_amount_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    amount_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar5 + sVar10;
    token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar9 = (long)tx_in.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      puVar5 = (pointer)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar5 = (pointer)operator_new(uVar9);
    }
    token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = puVar5 + uVar9;
    sVar10 = (long)tx_in.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)tx_in.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start = puVar5;
    if (sVar10 != 0) {
      token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar5;
      memmove(puVar5,tx_in.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = puVar5 + sVar10;
    this_00 = &asset_unblind.asset.data_;
    asset_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8
    ;
    ByteData::ByteData(this_00);
    this_01 = &asset_unblind.abf.data_;
    asset_unblind.asset.version_ = '\0';
    asset_unblind.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
    ByteData256::ByteData256(this_01);
    this_02 = &asset_unblind.vbf.data_;
    asset_unblind.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
    ByteData256::ByteData256(this_02);
    this_03 = &asset_unblind.value.data_;
    asset_unblind.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
    ByteData::ByteData(this_03);
    asset_unblind.value.version_ = '\0';
    token_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8
    ;
    ByteData::ByteData(&token_unblind.asset.data_);
    token_unblind.asset.version_ = '\0';
    token_unblind.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
    ByteData256::ByteData256(&token_unblind.abf.data_);
    token_unblind.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
    ByteData256::ByteData256(&token_unblind.vbf.data_);
    token_unblind.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
    ByteData::ByteData(&token_unblind.value.data_);
    token_unblind.value.version_ = '\0';
    ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_558,&tx_in.issuance_amount_);
    uVar3 = local_558.asset.version_;
    local_558.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialValue_006a2070;
    if (local_558.asset.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_558.asset.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (1 < uVar3) {
      ConfidentialValue::ConfidentialValue(&local_410,&tx_in.issuance_amount_);
      Script::Script(&local_238);
      CalculateUnblindIssueData
                (&local_558,blinding_key,&amount_rangeproof,&local_410,&local_238,&issue.asset);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this_00->data_,&local_558.asset.data_.data_);
      asset_unblind.asset.version_ = local_558.asset.version_;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this_01->data_,&local_558.abf.data_.data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this_02->data_,&local_558.vbf.data_.data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this_03->data_,&local_558.value.data_.data_);
      asset_unblind.value.version_ = local_558.value.version_;
      local_558.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
      if (local_558.value.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_558.value.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_558.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
      if (local_558.vbf.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_558.vbf.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_558.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
      if (local_558.abf.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_558.abf.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_558.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
      if (local_558.asset.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_558.asset.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      Script::~Script(&local_238);
      local_410._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
      if (local_410.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_410.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ByteData::ByteData((ByteData *)&local_558);
      puVar5 = amount_rangeproof.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      amount_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_558.asset._vptr_ConfidentialAssetId;
      amount_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_558.asset.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      amount_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_558.asset.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_558.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
      local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (puVar5 != (pointer)0x0) {
        operator_delete(puVar5);
      }
      if (local_558.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
        operator_delete(local_558.asset._vptr_ConfidentialAssetId);
      }
    }
    local_558.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
    local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar9 = (long)tx_in.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      pp_Var7 = (_func_int **)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      pp_Var7 = (_func_int **)operator_new(uVar9);
    }
    local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar9 + (long)pp_Var7);
    sVar10 = (long)tx_in.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)tx_in.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_558.asset._vptr_ConfidentialAssetId = pp_Var7;
    if (sVar10 != 0) {
      local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pp_Var7;
      memmove(pp_Var7,tx_in.inflation_keys_rangeproof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar10);
    }
    local_558.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)((long)pp_Var7 + sVar10);
    sVar6 = ByteData::GetDataSize((ByteData *)&local_558);
    if (local_558.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      operator_delete(local_558.asset._vptr_ConfidentialAssetId);
    }
    if (sVar6 != 0) {
      ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_558,&tx_in.inflation_keys_);
      uVar3 = local_558.asset.version_;
      local_558.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialValue_006a2070;
      if (local_558.asset.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_558.asset.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (1 < uVar3) {
        bVar11 = Privkey::IsValid(token_blinding_key);
        if (bVar11) {
          blinding_key = token_blinding_key;
        }
        ConfidentialValue::ConfidentialValue(&local_410,&tx_in.inflation_keys_);
        Script::Script(&local_238);
        CalculateUnblindIssueData
                  (&local_558,blinding_key,&token_rangeproof,&local_410,&local_238,&issue.token);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&token_unblind.asset.data_.data_,&local_558.asset.data_.data_);
        token_unblind.asset.version_ = local_558.asset.version_;
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&token_unblind.abf.data_.data_,&local_558.abf.data_.data_);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&token_unblind.vbf.data_.data_,&local_558.vbf.data_.data_);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&token_unblind.value.data_.data_,&local_558.value.data_.data_);
        token_unblind.value.version_ = local_558.value.version_;
        local_558.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
        if (local_558.value.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_558.value.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_558.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
        if (local_558.vbf.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_558.vbf.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_558.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
        if (local_558.abf.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_558.abf.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_558.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8
        ;
        if (local_558.asset.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_558.asset.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        Script::~Script(&local_238);
        local_410._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
        if (local_410.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_410.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        ByteData::ByteData((ByteData *)&local_558);
        puVar5 = token_rangeproof.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)local_558.asset._vptr_ConfidentialAssetId;
        token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_558.asset.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_558.asset.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_558.asset._vptr_ConfidentialAssetId = (_func_int **)0x0;
        local_558.asset.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_558.asset.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (puVar5 != (pointer)0x0) {
          operator_delete(puVar5);
        }
        if (local_558.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
          operator_delete(local_558.asset._vptr_ConfidentialAssetId);
        }
      }
    }
    uVar4 = tx_in_index_local;
    local_488.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_488.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_488.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar9 = (long)tx_in.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      puVar5 = (pointer)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar5 = (pointer)operator_new(uVar9);
    }
    local_488.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar5 + uVar9;
    sVar10 = (long)tx_in.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)tx_in.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_488.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar5;
    if (sVar10 != 0) {
      local_488.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5;
      memmove(puVar5,tx_in.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    local_488.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5 + sVar10;
    local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar9 = (long)tx_in.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tx_in.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      puVar5 = (pointer)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar5 = (pointer)operator_new(uVar9);
    }
    local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar5 + uVar9;
    sVar10 = (long)tx_in.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)tx_in.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar5;
    if (sVar10 != 0) {
      local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5;
      memmove(puVar5,tx_in.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5 + sVar10;
    ConfidentialValue::ConfidentialValue(&local_288,&asset_unblind.value);
    ConfidentialValue::ConfidentialValue(&local_2b0,&token_unblind.value);
    local_4c8 = (void *)0x0;
    pvStack_4c0 = (void *)0x0;
    local_4b8 = 0;
    uVar9 = (long)amount_rangeproof.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)amount_rangeproof.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      pvVar8 = operator_new(uVar9);
    }
    local_4b8 = uVar9 + (long)pvVar8;
    sVar10 = (long)amount_rangeproof.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)amount_rangeproof.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_4c8 = pvVar8;
    if (sVar10 != 0) {
      pvStack_4c0 = pvVar8;
      memmove(pvVar8,amount_rangeproof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    pvStack_4c0 = (void *)((long)pvVar8 + sVar10);
    local_468 = (void *)0x0;
    pvStack_460 = (void *)0x0;
    local_458 = 0;
    uVar9 = (long)token_rangeproof.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)token_rangeproof.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      pvVar8 = operator_new(uVar9);
    }
    local_458 = uVar9 + (long)pvVar8;
    sVar10 = (long)token_rangeproof.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)token_rangeproof.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_468 = pvVar8;
    if (sVar10 != 0) {
      pvStack_460 = pvVar8;
      memmove(pvVar8,token_rangeproof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    pvStack_460 = (void *)((long)pvVar8 + sVar10);
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_468;
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_4c8;
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffa58;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = tx_in_index_local;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uStack_5a0;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    SetIssuance(this,uVar4,&local_488,&local_4a8,&local_288,&local_2b0,issuance_amount_rangeproof,
                inflation_keys_rangeproof);
    if (local_468 != (void *)0x0) {
      operator_delete(local_468);
    }
    if (local_4c8 != (void *)0x0) {
      operator_delete(local_4c8);
    }
    local_2b0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
    if (local_2b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_288._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
    if (local_288.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4a8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_488.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_488.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
    push_back(__return_storage_ptr__,&asset_unblind);
    ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
    push_back(__return_storage_ptr__,&token_unblind);
    token_unblind.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
    if (token_unblind.value.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(token_unblind.value.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    token_unblind.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
    if (token_unblind.vbf.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(token_unblind.vbf.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    token_unblind.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
    if (token_unblind.abf.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(token_unblind.abf.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    token_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8
    ;
    if (token_unblind.asset.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(token_unblind.asset.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    asset_unblind.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
    if (asset_unblind.value.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(asset_unblind.value.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    asset_unblind.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
    if (asset_unblind.vbf.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(asset_unblind.vbf.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    asset_unblind.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
    if (asset_unblind.abf.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(asset_unblind.abf.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    asset_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8
    ;
    if ((void *)CONCAT44(asset_unblind.asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         asset_unblind.asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(asset_unblind.asset.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       asset_unblind.asset.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    if (token_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(token_rangeproof.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (amount_rangeproof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(amount_rangeproof.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    issue.token._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
    if (issue.token.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(issue.token.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    issue.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
    if (issue.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(issue.asset.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    issue.entropy._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
    if (issue.entropy.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(issue.entropy.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ConfidentialTxIn::~ConfidentialTxIn(&tx_in);
    return __return_storage_ptr__;
  }
  asset_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)0x59e2f1;
  asset_unblind.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb15;
  asset_unblind.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "UnblindTxIn";
  logger::log<unsigned_int&>
            ((CfdSourceLocation *)&asset_unblind,kCfdLogLevelWarning,
             "Failed to unblind TxIn. Target TxIn already unblinded.: tx_in_index=[{}]",
             &tx_in_index_local);
  this_04 = (CfdException *)__cxa_allocate_exception(0x30);
  asset_unblind.asset._vptr_ConfidentialAssetId =
       (_func_int **)
       &asset_unblind.asset.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&asset_unblind,"Failed to unblind TxIn. Target TxIn already unblinded.","");
  CfdException::CfdException(this_04,kCfdIllegalStateError,(string *)&asset_unblind);
  __cxa_throw(this_04,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<UnblindParameter> ConfidentialTransaction::UnblindTxIn(
    uint32_t tx_in_index, const Privkey &blinding_key,
    const Privkey token_blinding_key) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  ConfidentialTxIn tx_in(vin_[tx_in_index]);
  if (((!tx_in.GetIssuanceAmount().HasBlinding()) &&
       (!tx_in.GetInflationKeys().HasBlinding())) ||
      ((tx_in.GetIssuanceAmountRangeproof().GetDataSize() == 0) &&
       (tx_in.GetInflationKeysRangeproof().GetDataSize() == 0))) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to unblind TxIn. Target TxIn already unblinded.: "
        "tx_in_index=[{}]",
        tx_in_index);
    throw CfdException(
        kCfdIllegalStateError,
        "Failed to unblind TxIn. Target TxIn already unblinded.");
  }

  IssuanceParameter issue = CalculateIssuanceValue(
      tx_in.GetTxid(), tx_in.GetVout(), true, tx_in.GetAssetEntropy(),
      tx_in.GetBlindingNonce());

  ByteData amount_rangeproof = tx_in.GetIssuanceAmountRangeproof();
  ByteData token_rangeproof = tx_in.GetInflationKeysRangeproof();

  UnblindParameter asset_unblind;
  UnblindParameter token_unblind;

  if (tx_in.GetIssuanceAmount().HasBlinding()) {
    asset_unblind = CalculateUnblindIssueData(
        blinding_key, amount_rangeproof, tx_in.GetIssuanceAmount(), Script(),
        issue.asset);
    amount_rangeproof = ByteData();
  }

  if (tx_in.GetInflationKeysRangeproof().GetDataSize() != 0) {
    if (tx_in.GetInflationKeys().HasBlinding()) {
      token_unblind = CalculateUnblindIssueData(
          (token_blinding_key.IsValid()) ? token_blinding_key : blinding_key,
          token_rangeproof, tx_in.GetInflationKeys(), Script(), issue.token);
      token_rangeproof = ByteData();
    }
  }

  // clear and set unblind value to txin
  SetIssuance(
      tx_in_index, tx_in.GetBlindingNonce(), tx_in.GetAssetEntropy(),
      asset_unblind.value, token_unblind.value, amount_rangeproof,
      token_rangeproof);
  std::vector<UnblindParameter> result;
  result.push_back(asset_unblind);
  result.push_back(token_unblind);

  return result;
}